

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O2

bool lzham::check_params(lzham_decompress_params *pParams)

{
  if ((((pParams != (lzham_decompress_params *)0x0) && (pParams->m_struct_size == 0x28)) &&
      (0xfffffff0 < pParams->m_dict_size_log2 - 0x1e)) &&
     ((pParams->m_num_seed_bytes == 0 ||
      (((pParams->m_decompress_flags & 1) == 0 &&
       (pParams->m_num_seed_bytes <= (uint)(1 << ((byte)pParams->m_dict_size_log2 & 0x1f)) &&
        pParams->m_pSeed_bytes != (void *)0x0)))))) {
    return true;
  }
  return false;
}

Assistant:

static bool check_params(const lzham_decompress_params *pParams)
   {
      if ((!pParams) || (pParams->m_struct_size != sizeof(lzham_decompress_params)))
      {
         LZHAM_LOG_ERROR(1000);
         return false;
      }

      if ((pParams->m_dict_size_log2 < CLZDecompBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZDecompBase::cMaxDictSizeLog2))
      {
         LZHAM_LOG_ERROR(1001);
         return false;
      }

      if (pParams->m_num_seed_bytes)
      {
         if (((pParams->m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED) != 0) || (!pParams->m_pSeed_bytes))
         {
            LZHAM_LOG_ERROR(1002);
            return false;
         }
         if (pParams->m_num_seed_bytes > (1U << pParams->m_dict_size_log2))
         {
            LZHAM_LOG_ERROR(1003);
            return false;
         }
      }
      return true;
   }